

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O1

bool __thiscall QXmlUtils::isNCName(QXmlUtils *this,QStringView ncName)

{
  QChar QVar1;
  bool bVar2;
  bool bVar3;
  char16_t *pcVar4;
  long lVar5;
  
  pcVar4 = (char16_t *)ncName.m_size;
  if (this != (QXmlUtils *)0x0) {
    QVar1.ucs = *pcVar4;
    bVar2 = isLetter(QVar1);
    if ((((bVar2) || (QVar1.ucs == L'_')) || (QVar1.ucs == L':')) &&
       (QVar1.ucs = *pcVar4, bVar2 = isNameChar(QVar1), QVar1.ucs != L':' && bVar2)) {
      lVar5 = 2;
      while( true ) {
        bVar2 = (long)this * 2 == lVar5;
        if (bVar2) {
          return bVar2;
        }
        QVar1.ucs = *(char16_t *)((long)pcVar4 + lVar5);
        bVar3 = isNameChar(QVar1);
        if (!bVar3) break;
        lVar5 = lVar5 + 2;
        if (QVar1.ucs == L':') {
          return bVar2;
        }
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }